

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

bool __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::IsFreeOrDecommitted
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address)

{
  char *pcVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  uint i;
  undefined8 *in_FS_OFFSET;
  
  pcVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  if ((address < pcVar1) ||
     (pcVar1 + ((this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount -
               (ulong)(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                      secondaryAllocPageCount) * 0x1000 <= address)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.h"
                       ,0x153,"(this->IsInSegment(address))","this->IsInSegment(address)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  i = (uint)((int)address -
            *(int *)&(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address) >>
      0xc;
  BVar5 = BVStatic<272UL>::Test(&this->decommitPages,i);
  bVar4 = true;
  if (BVar5 == '\0') {
    BVar5 = BVStatic<272UL>::Test(&this->freePages,i);
    bVar4 = BVar5 != '\0';
  }
  return bVar4;
}

Assistant:

bool IsFreeOrDecommitted(void* address) const
    {
        Assert(this->IsInSegment(address));

        uint base = GetBitRangeBase(address);
        return this->TestInDecommitPagesBitVector(base) || this->TestInFreePagesBitVector(base);
    }